

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawutil.cpp
# Opt level: O2

void qDrawShadePanel(QPainter *p,QRect *r,QPalette *pal,bool sunken,int lineWidth,QBrush *fill)

{
  int x;
  int y;
  
  x = (r->x1).m_i;
  y = (r->y1).m_i;
  qDrawShadePanel(p,x,y,((r->x2).m_i - x) + 1,((r->y2).m_i - y) + 1,pal,sunken,lineWidth,fill);
  return;
}

Assistant:

void qDrawShadePanel(QPainter *p, const QRect &r,
                      const QPalette &pal, bool sunken,
                      int lineWidth, const QBrush *fill)
{
    qDrawShadePanel(p, r.x(), r.y(), r.width(), r.height(), pal, sunken,
                     lineWidth, fill);
}